

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_send_alert(ptls_t *tls,ptls_buffer_t *sendbuf,uint8_t level,uint8_t description)

{
  long lVar1;
  int iVar2;
  undefined1 in_CL;
  undefined1 in_DL;
  long *in_RSI;
  long in_RDI;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  int ret;
  size_t rec_start;
  size_t in_stack_ffffffffffffffa8;
  size_t len;
  void *in_stack_ffffffffffffffb0;
  long *src;
  ptls_buffer_t *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  st_ptls_traffic_protection_t *enc;
  size_t rec_start_00;
  undefined1 in_stack_ffffffffffffffd8;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  
  uVar3 = 0x15;
  uVar4 = 3;
  uVar5 = 3;
  iVar2 = ptls_buffer__do_pushv
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (iVar2 == 0) {
    rec_start_00 = 2;
    len = 2;
    src = in_RSI;
    iVar2 = ptls_buffer__do_pushv(in_stack_ffffffffffffffb8,in_RSI,2);
    if (iVar2 == 0) {
      enc = (st_ptls_traffic_protection_t *)in_RSI[2];
      iVar2 = ptls_buffer__do_pushv(in_stack_ffffffffffffffb8,src,len);
      if (iVar2 == 0) {
        lVar1 = in_RSI[2];
        if (rec_start_00 == 0xffffffffffffffff) {
          iVar2 = ptls_buffer__adjust_quic_blocksize
                            ((ptls_buffer_t *)enc,
                             CONCAT17(in_CL,CONCAT16(in_DL,in_stack_ffffffffffffffc0)));
          if (iVar2 != 0) {
            return iVar2;
          }
        }
        else {
          for (; rec_start_00 != 0; rec_start_00 = rec_start_00 - 1) {
            *(char *)((long)enc + (*in_RSI - rec_start_00)) =
                 (char)((ulong)(lVar1 - (long)enc) >> (((char)rec_start_00 + -1) * '\b' & 0x3fU));
          }
          rec_start_00 = 0;
        }
        if ((*(long *)(in_RDI + 0xf8) != 0) && (7 < *(uint *)(in_RDI + 8))) {
          iVar2 = buffer_encrypt_record
                            ((ptls_buffer_t *)
                             CONCAT44(iVar2,CONCAT13(uVar5,CONCAT12(uVar4,CONCAT11(uVar3,
                                                  in_stack_ffffffffffffffd8)))),rec_start_00,enc);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int ptls_send_alert(ptls_t *tls, ptls_buffer_t *sendbuf, uint8_t level, uint8_t description)
{
    size_t rec_start = sendbuf->off;
    int ret = 0;

    buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_ALERT, { ptls_buffer_push(sendbuf, level, description); });
    /* encrypt the alert if we have the encryption keys, unless when it is the early data key */
    if (tls->traffic_protection.enc.aead != NULL && !(tls->state <= PTLS_STATE_CLIENT_EXPECT_FINISHED)) {
        if ((ret = buffer_encrypt_record(sendbuf, rec_start, &tls->traffic_protection.enc)) != 0)
            goto Exit;
    }

Exit:
    return ret;
}